

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O1

RGBResult * __thiscall
AsyncRgbLedAnalyzer::ReadRGBTriple(RGBResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  uint uVar1;
  RGBResult *pRVar2;
  bool bVar3;
  U64 UVar4;
  byte bVar5;
  ColorLayout layout;
  RGBValue RVar6;
  U64 UVar7;
  uint uVar8;
  uint uVar9;
  undefined1 uVar10;
  int iVar11;
  U16 channels [3];
  DataBuilder builder;
  U64 value;
  ReadResult bitResult;
  U16 local_78 [4];
  U64 local_70;
  DataBuilder local_68 [8];
  RGBResult *local_60;
  AsyncRgbLedAnalyzer *local_58;
  undefined8 local_50;
  ReadResult local_48;
  
  local_58 = this;
  bVar5 = AsyncRgbLedAnalyzerSettings::BitSize
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  local_78[2] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_70 = 0;
  __return_storage_ptr__->mValid = false;
  __return_storage_ptr__->mIsReset = false;
  (__return_storage_ptr__->mRGB).red = 0;
  (__return_storage_ptr__->mRGB).green = 0;
  (__return_storage_ptr__->mRGB).blue = 0;
  (__return_storage_ptr__->mRGB).padding = 0;
  __return_storage_ptr__->mValueBeginSample = 0;
  __return_storage_ptr__->mValueEndSample = 0;
  DataBuilder::DataBuilder(local_68);
  uVar10 = __return_storage_ptr__->mIsReset;
  uVar1 = (uint)bVar5;
  UVar7 = __return_storage_ptr__->mValueEndSample;
  local_60 = __return_storage_ptr__;
  for (iVar11 = 0; iVar11 < 3; iVar11 = iVar11 + 1) {
    local_50 = 0;
    DataBuilder::Reset((ulonglong *)local_68,(ShiftOrder)&local_50,0);
    uVar8 = 0;
    uVar9 = 0;
    if (bVar5 != 0) {
      while (ReadBit(&local_48,local_58), UVar4 = local_48.mEndSample, bVar3 = local_48.mValid,
            uVar9 = uVar8, local_48.mValid != false) {
        if (uVar8 == 0 && iVar11 == 0) {
          local_70 = local_48.mBeginSample;
        }
        DataBuilder::AddBit((BitState)local_68);
        UVar7 = UVar4;
        uVar10 = local_48.mIsReset;
        if ((bVar3 == false) || (uVar8 = uVar8 + 1, uVar9 = uVar1, uVar1 == uVar8)) break;
      }
    }
    if (uVar9 != uVar1) break;
    local_78[iVar11] = (U16)local_50;
  }
  pRVar2 = local_60;
  local_60->mValueEndSample = UVar7;
  local_60->mValueBeginSample = local_70;
  local_60->mIsReset = (bool)uVar10;
  if (iVar11 == 3) {
    layout = AsyncRgbLedAnalyzerSettings::GetColorLayout
                       ((local_58->mSettings)._M_t.
                        super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                        .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
    RVar6 = RGBValue::CreateFromControllerOrder(layout,local_78);
    pRVar2->mRGB = RVar6;
    pRVar2->mValid = true;
  }
  DataBuilder::~DataBuilder(local_68);
  return pRVar2;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadRGBTriple() -> RGBResult
{
    const U8 bitSize = mSettings->BitSize();
    U16 channels[ 3 ] = { 0, 0, 0 };
    RGBResult result;

    DataBuilder builder;
    int channel = 0;

    for( ; channel < 3; )
    {
        U64 value = 0;
        builder.Reset( &value, AnalyzerEnums::MsbFirst, bitSize );
        int i = 0;

        for( ; i < bitSize; ++i )
        {
            auto bitResult = ReadBit();

            if( !bitResult.mValid )
            {
                break;
            }

            // for the first bit of channel 0, record the beginning time
            // for accurate frame positions in the results
            if( ( i == 0 ) && ( channel == 0 ) )
            {
                result.mValueBeginSample = bitResult.mBeginSample;
            }

            result.mValueEndSample = bitResult.mEndSample;
            builder.AddBit( bitResult.mBitValue );
            result.mIsReset = bitResult.mIsReset;
        }

        if( i == bitSize )
        {
            // we saw a complete channel, save it
            channels[ channel++ ] = value;
        }
        else
        {
            // partial data due to reset or invalid timing, discard
            break;
        }
    }

    if( channel == 3 )
    {
        // we saw three complete channels, we can use this
        result.mRGB = RGBValue::CreateFromControllerOrder( mSettings->GetColorLayout(), channels );
        result.mValid = true;
    } // in all other cases, mValid stays false - no RGB data was written

    return result;
}